

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

void nni_sock_closeall(void)

{
  nni_sock *s;
  
  nni_mtx_lock(&sock_lk);
  s = (nni_sock *)nni_list_first(&sock_list);
  while (s != (nni_sock *)0x0) {
    s->s_ref = s->s_ref + 1;
    nni_list_node_remove(&s->s_node);
    nni_mtx_unlock(&sock_lk);
    nni_sock_close(s);
    nni_mtx_lock(&sock_lk);
    s = (nni_sock *)nni_list_first(&sock_list);
  }
  nni_mtx_unlock(&sock_lk);
  return;
}

Assistant:

void
nni_sock_closeall(void)
{
	nni_sock *s;

	for (;;) {
		nni_mtx_lock(&sock_lk);
		if ((s = nni_list_first(&sock_list)) == NULL) {
			nni_mtx_unlock(&sock_lk);
			return;
		}
		// Bump the reference count.  The close call below
		// will drop it.
		s->s_ref++;
		nni_list_node_remove(&s->s_node);
		nni_mtx_unlock(&sock_lk);
		nni_sock_close(s);
	}
}